

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

SQObject __thiscall SQCompiler::ExpectScalar(SQCompiler *this)

{
  long lVar1;
  SQCompiler *in_RDI;
  SQObject SVar2;
  SQObject val;
  SQCompiler *in_stack_ffffffffffffffb0;
  undefined8 in_stack_fffffffffffffff0;
  SQChar *s;
  SQObjectValue this_00;
  undefined4 uVar3;
  
  uVar3 = (undefined4)((ulong)in_stack_fffffffffffffff0 >> 0x20);
  s = (SQChar *)CONCAT44(uVar3,0x1000001);
  this_00.pTable = (SQTable *)0x0;
  lVar1 = in_RDI->_token;
  if (lVar1 == 0x2d) {
    Lex(in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffb0 = (SQCompiler *)in_RDI->_token;
    if (in_stack_ffffffffffffffb0 == (SQCompiler *)0x104) {
      s = (SQChar *)0x5000002;
      this_00.nInteger = -(in_RDI->_lex)._nvalue;
    }
    else if (in_stack_ffffffffffffffb0 == (SQCompiler *)0x105) {
      s = (SQChar *)0x5000004;
      this_00.nInteger = CONCAT44((int)((ulong)this_00 >> 0x20),(in_RDI->_lex)._fvalue) ^ 0x80000000
      ;
    }
    else {
      Error(in_RDI,"scalar expected : integer,float");
    }
  }
  else if (lVar1 == 0x103) {
    sqvector<char>::size(&(in_RDI->_lex)._longstr);
    SVar2 = SQFuncState::CreateString((SQFuncState *)this_00.pTable,s,(SQInteger)in_RDI);
    this_00 = SVar2._unVal;
    s = (SQChar *)(ulong)SVar2._type;
  }
  else if (lVar1 == 0x104) {
    s = (SQChar *)CONCAT44(uVar3,0x5000002);
    this_00 = (SQObjectValue)(in_RDI->_lex)._nvalue;
  }
  else if (lVar1 == 0x105) {
    s = (SQChar *)CONCAT44(uVar3,0x5000004);
    this_00.nInteger._4_4_ = 0;
    this_00.fFloat = (in_RDI->_lex)._fvalue;
  }
  else if (lVar1 - 0x13bU < 2) {
    s = (SQChar *)CONCAT44(uVar3,0x1000008);
    this_00 = (SQObjectValue)(long)(int)(uint)(in_RDI->_token == 0x13b);
  }
  else {
    Error(in_RDI,"scalar expected : integer,float or string");
  }
  Lex(in_stack_ffffffffffffffb0);
  SVar2._0_8_ = (ulong)s & 0xffffffff;
  SVar2._unVal.pTable = this_00.pTable;
  return SVar2;
}

Assistant:

SQObject ExpectScalar()
    {
        SQObject val;
        val._type = OT_NULL; val._unVal.nInteger = 0; //shut up GCC 4.x
        switch(_token) {
            case TK_INTEGER:
                val._type = OT_INTEGER;
                val._unVal.nInteger = _lex._nvalue;
                break;
            case TK_FLOAT:
                val._type = OT_FLOAT;
                val._unVal.fFloat = _lex._fvalue;
                break;
            case TK_STRING_LITERAL:
                val = _fs->CreateString(_lex._svalue,_lex._longstr.size()-1);
                break;
            case TK_TRUE:
            case TK_FALSE:
                val._type = OT_BOOL;
                val._unVal.nInteger = _token == TK_TRUE ? 1 : 0;
                break;
            case '-':
                Lex();
                switch(_token)
                {
                case TK_INTEGER:
                    val._type = OT_INTEGER;
                    val._unVal.nInteger = -_lex._nvalue;
                break;
                case TK_FLOAT:
                    val._type = OT_FLOAT;
                    val._unVal.fFloat = -_lex._fvalue;
                break;
                default:
                    Error(_SC("scalar expected : integer,float"));
                }
                break;
            default:
                Error(_SC("scalar expected : integer,float or string"));
        }
        Lex();
        return val;
    }